

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.hpp
# Opt level: O0

void mserialize::serialize<(anonymous_namespace)::Tree,OutputStream>(Tree *in,OutputStream *ostream)

{
  OutputStream *in_RDI;
  Tree *unaff_retaddr;
  
  StructSerializer<(anonymous_namespace)::Tree,_std::integral_constant<int_(anonymous_namespace)::Tree::*,_&(anonymous_namespace)::Tree::value>,_std::integral_constant<(anonymous_namespace)::Tree_*(anonymous_namespace)::Tree::*,_&(anonymous_namespace)::Tree::left>,_std::integral_constant<(anonymous_namespace)::Tree_*(anonymous_namespace)::Tree::*,_&(anonymous_namespace)::Tree::right>_>
  ::serialize<OutputStream>(unaff_retaddr,in_RDI);
  return;
}

Assistant:

void serialize(const T& in, OutputStream& ostream)
{
  detail::Serializer<T>::type::serialize(in, ostream);
}